

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_setRange_success_indexInBoundsRangeBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 3;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x118dfc;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  array.buffer[0] = '0';
  array.buffer[1] = '1';
  array.buffer[2] = '2';
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  c = '5';
  uStack_60 = 0x118e34;
  bVar1 = private_ACUtils_ADynArray_setRange(&array,2,2,&c,1);
  if (bVar1 == true) {
    uStack_60 = 0x118e4e;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x6e4);
    if (array.size == 4) {
      uStack_60 = 0x118e6e;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x6e5);
      if (array.capacity == 8) {
        uStack_60 = 0x118e8e;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x6e6);
        if (array.buffer == (char *)0x0) {
          ppcVar7 = &local_68;
          pcVar5 = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar8 = "(void*) array.buffer != NULL";
          pcVar9 = "(void*) array.buffer";
          iVar2 = 0x6e7;
LAB_001193dd:
          uStack_60 = 0;
          local_68 = (char *)0x0;
          *(code **)((long)ppcVar7 + -8) =
               test_ADynArray_setRange_success_indexInBoundsRangeBeyondSize_bufferExpanded_fn;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
        }
        uStack_60 = 0x118eab;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x6e7);
        if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
          ppcVar7 = &local_68;
          pcVar5 = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar8 = "(void*) array.growStrategy != NULL";
          pcVar9 = "(void*) array.growStrategy";
          iVar2 = 0x6e8;
          goto LAB_001193dd;
        }
        uStack_60 = 0x118ec8;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x6e8);
        pcVar9 = array.buffer;
        array.buffer[array.size] = '\0';
        if (array.buffer == (char *)0x0) {
          pcVar8 = "";
          pcVar9 = "(null)";
LAB_00119187:
          local_70 = "0155";
          pcStack_80 = "array.buffer == \"0155\"";
          pcVar4 = "array.buffer == \"0155\"";
          iVar2 = 0x6ea;
        }
        else {
          uStack_60 = 0x118ef3;
          iVar2 = strcmp("0155",array.buffer);
          if (iVar2 != 0) {
            pcVar8 = "\"";
            goto LAB_00119187;
          }
          uStack_60 = 0x118f0c;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x6ea);
          if (private_ACUtilsTest_ADynArray_reallocCount != 0) {
            ppcVar7 = &local_78;
            local_70 = "0";
            local_78 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
            pcVar9 = "private_ACUtilsTest_ADynArray_reallocCount";
            iVar2 = 0x6eb;
            goto LAB_001193dd;
          }
          uStack_60 = 0x118f2d;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x6eb);
          c = '1';
          uStack_60 = 0x118f4f;
          bVar1 = private_ACUtils_ADynArray_setRange(&array,2,4,&c,1);
          if (bVar1 != true) {
            pcVar4 = 
            "private_ACUtils_ADynArray_setRange(&array, 2, 4, &(c), sizeof(*(&array)->buffer)) == true"
            ;
            pcVar5 = 
            "private_ACUtils_ADynArray_setRange(&array, 2, 4, &(c), sizeof(*(&array)->buffer))";
            iVar2 = 0x6ed;
            goto LAB_00119244;
          }
          uStack_60 = 0x118f69;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x6ed);
          if (array.size != 6) {
            local_70 = "6";
            pcVar4 = "array.size == 6";
            pcVar5 = "array.size";
            iVar2 = 0x6ee;
            local_68 = (char *)0x6;
            pcVar8 = (char *)array.size;
            goto LAB_001192b8;
          }
          uStack_60 = 0x118f89;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x6ee);
          if (array.capacity != 8) {
            iVar2 = 0x6ef;
            goto LAB_001192b2;
          }
          uStack_60 = 0x118fa9;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x6ef);
          if (array.buffer == (char *)0x0) {
            ppcVar7 = &local_68;
            pcVar5 = "Assertion \'_ck_x != NULL\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %#x";
            pcVar8 = "(void*) array.buffer != NULL";
            pcVar9 = "(void*) array.buffer";
            iVar2 = 0x6f0;
            goto LAB_001193dd;
          }
          uStack_60 = 0x118fc6;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x6f0);
          if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
            ppcVar7 = &local_68;
            pcVar5 = "Assertion \'_ck_x != NULL\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %#x";
            pcVar8 = "(void*) array.growStrategy != NULL";
            pcVar9 = "(void*) array.growStrategy";
            iVar2 = 0x6f1;
            goto LAB_001193dd;
          }
          uStack_60 = 0x118fe3;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x6f1);
          pcVar9 = array.buffer;
          array.buffer[array.size] = '\0';
          if (array.buffer == (char *)0x0) {
            pcVar9 = "(null)";
            pcVar8 = "";
          }
          else {
            uStack_60 = 0x11900e;
            iVar2 = strcmp("011111",array.buffer);
            if (iVar2 == 0) {
              uStack_60 = 0x119027;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x6f3);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                uStack_60 = 0x119048;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x6f4);
                uStack_60 = 0x119051;
                (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
                return;
              }
              ppcVar7 = &local_78;
              local_70 = "0";
              local_78 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
              pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
              pcVar9 = "private_ACUtilsTest_ADynArray_reallocCount";
              iVar2 = 0x6f4;
              goto LAB_001193dd;
            }
            pcVar8 = "\"";
          }
          local_70 = "011111";
          pcStack_80 = "array.buffer == \"011111\"";
          pcVar4 = "array.buffer == \"011111\"";
          iVar2 = 0x6f3;
        }
        pcStack_80 = pcStack_80 + 0x10;
        pcVar5 = "array.buffer";
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        local_68 = "\"";
        local_78 = "\"";
        ppcVar6 = &pcStack_90;
        pcStack_90 = pcVar9;
        pcStack_88 = pcVar8;
        goto LAB_00119392;
      }
      iVar2 = 0x6e6;
LAB_001192b2:
      local_70 = "8";
      pcVar5 = "array.capacity";
      pcVar4 = "array.capacity == 8";
      local_68 = (char *)0x8;
      pcVar8 = (char *)array.capacity;
    }
    else {
      local_70 = "4";
      pcVar4 = "array.size == 4";
      pcVar5 = "array.size";
      iVar2 = 0x6e5;
      local_68 = (char *)0x4;
      pcVar8 = (char *)array.size;
    }
  }
  else {
    pcVar4 = 
    "private_ACUtils_ADynArray_setRange(&array, 2, 2, &(c), sizeof(*(&array)->buffer)) == true";
    pcVar5 = "private_ACUtils_ADynArray_setRange(&array, 2, 2, &(c), sizeof(*(&array)->buffer))";
    iVar2 = 0x6e4;
LAB_00119244:
    pcVar8 = (char *)(ulong)bVar1;
    local_70 = "true";
    local_68 = (char *)0x1;
  }
LAB_001192b8:
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar6 = &local_70;
LAB_00119392:
  uStack_60 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar8;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x119399;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar3,pcVar4,pcVar5);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_setRange_success_indexInBoundsRangeBeyondSize)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 3;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "012", 3);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '5';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_setRange(&array, 2, 2, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 4);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.buffer[array.size] = '\0';
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0155");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    c = '1';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_setRange(&array, 2, 4, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 6);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.buffer[array.size] = '\0';
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "011111");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}